

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O0

int __thiscall ninx::parser::TokenReader::check_limiter(TokenReader *this,char limiter)

{
  char cVar1;
  int iVar2;
  Token *pTVar3;
  Limiter *local_38;
  Token *token;
  char limiter_local;
  TokenReader *this_local;
  
  pTVar3 = peek_token(this);
  if (pTVar3 == (Token *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    iVar2 = (*pTVar3->_vptr_Token[2])();
    if (iVar2 == 1) {
      if (pTVar3 == (Token *)0x0) {
        local_38 = (Limiter *)0x0;
      }
      else {
        local_38 = (Limiter *)
                   __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                                  &lexer::token::Limiter::typeinfo,0);
      }
      cVar1 = lexer::token::Limiter::get_limiter(local_38);
      if (cVar1 == limiter) {
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ninx::parser::TokenReader::check_limiter(char limiter) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    if (token->get_type() != Type::LIMITER) {
        return 0;
    }

    if (dynamic_cast<ninx::lexer::token::Limiter*>(token)->get_limiter() == limiter) {
        return 1;
    }

    return 0;
}